

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ConsumeIdentifier(Parser *this,string *output,ErrorMaker error)

{
  TokenType TVar1;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_IDENTIFIER) {
    std::__cxx11::string::_M_assign((string *)output);
    io::Tokenizer::Next(this->input_);
  }
  else {
    RecordError(this,error);
  }
  return TVar1 == TYPE_IDENTIFIER;
}

Assistant:

bool Parser::ConsumeIdentifier(std::string* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    *output = input_->current().text;
    input_->Next();
    return true;
  } else {
    RecordError(error);
    return false;
  }
}